

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

string * __thiscall setup::info::get_key(string *__return_storage_ptr__,info *this,string *password)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  runtime_error *this_00;
  string encoded_password;
  
  paVar1 = &encoded_password.field_2;
  encoded_password._M_string_length = 0;
  encoded_password.field_2._M_local_buf[0] = '\0';
  encoded_password._M_dataplus._M_p = (pointer)paVar1;
  util::from_utf8(password,&encoded_password,this->codepage);
  if ((this->header).password.type == PBKDF2_SHA256_XChaCha20) {
    if ((this->header).password_salt._M_string_length != 0x2c) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unexpected password salt size");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    crypto::pbkdf2<crypto::iterated_hash<crypto::sha256_transform>_>::derive
              ((EVP_PKEY_CTX *)encoded_password._M_dataplus._M_p,
               (uchar *)encoded_password._M_string_length,
               (size_t *)(this->header).password_salt._M_dataplus._M_p);
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pcVar3 = (this->header).password_salt._M_dataplus._M_p;
    *(undefined8 *)(pcVar2 + 0x30) = *(undefined8 *)(pcVar3 + 0x24);
    uVar4 = *(undefined8 *)(pcVar3 + 0x1c);
    *(undefined8 *)(pcVar2 + 0x20) = *(undefined8 *)(pcVar3 + 0x14);
    *(undefined8 *)(pcVar2 + 0x28) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)encoded_password._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(encoded_password.field_2._M_allocated_capacity._1_7_,
                    encoded_password.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = encoded_password.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = encoded_password._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(encoded_password.field_2._M_allocated_capacity._1_7_,
                    encoded_password.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = encoded_password._M_string_length;
    encoded_password._M_string_length = 0;
    encoded_password.field_2._M_local_buf[0] = '\0';
    encoded_password._M_dataplus._M_p = (pointer)paVar1;
  }
  std::__cxx11::string::~string((string *)&encoded_password);
  return __return_storage_ptr__;
}

Assistant:

std::string info::get_key(const std::string & password) {
	
	std::string encoded_password;
	util::from_utf8(password, encoded_password, codepage);
	
	if(header.password.type == crypto::PBKDF2_SHA256_XChaCha20) {
		
		#if INNOEXTRACT_HAVE_DECRYPTION
		
		// 16 bytes PBKDF2 salt + 4 bytes PBKDF2 iterations + 24 bytes ChaCha20 base nonce
		if(header.password_salt.length() != 20 + crypto::xchacha20::nonce_size) {
			throw std::runtime_error("unexpected password salt size");
		}
		
		std::string result;
		result.resize(crypto::xchacha20::key_size + crypto::xchacha20::nonce_size);
		typedef crypto::pbkdf2<crypto::sha256> pbkdf2;
		pbkdf2::derive(encoded_password.c_str(), encoded_password.length(), &header.password_salt[0], 16,
		               util::little_endian::load<boost::uint32_t>(&header.password_salt[16]), &result[0],
		               crypto::xchacha20::key_size);
		
		std::memcpy(&result[crypto::xchacha20::key_size], &header.password_salt[20],
		            crypto::xchacha20::nonce_size);
		
		return result;
		
		#endif
		
	}
	
	return encoded_password;
}